

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O1

void ARGBMirrorRow_SSE2(uint8_t *src,uint8_t *dst,int width)

{
  bool bVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint8_t *puVar5;
  long lVar6;
  long lVar7;
  uint8_t *puVar8;
  
  puVar8 = src + (long)width * 4 + -0x10;
  lVar6 = (long)width;
  do {
    uVar2 = *(undefined4 *)puVar8;
    uVar3 = *(undefined4 *)(puVar8 + 4);
    uVar4 = *(undefined4 *)(puVar8 + 8);
    puVar5 = puVar8 + 0xc;
    puVar8 = puVar8 + -0x10;
    *(undefined4 *)dst = *(undefined4 *)puVar5;
    *(undefined4 *)(dst + 4) = uVar4;
    *(undefined4 *)(dst + 8) = uVar3;
    *(undefined4 *)(dst + 0xc) = uVar2;
    dst = dst + 0x10;
    lVar7 = lVar6 + -4;
    bVar1 = 3 < lVar6;
    lVar6 = lVar7;
  } while (lVar7 != 0 && bVar1);
  return;
}

Assistant:

void ARGBMirrorRow_SSE2(const uint8_t* src, uint8_t* dst, int width) {
  intptr_t temp_width = (intptr_t)(width);
  asm volatile(

      "lea         -0x10(%0,%2,4),%0             \n"

      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"
      "pshufd      $0x1b,%%xmm0,%%xmm0           \n"
      "lea         -0x10(%0),%0                  \n"
      "movdqu      %%xmm0,(%1)                   \n"
      "lea         0x10(%1),%1                   \n"
      "sub         $0x4,%2                       \n"
      "jg          1b                            \n"
      : "+r"(src),        // %0
        "+r"(dst),        // %1
        "+r"(temp_width)  // %2
      :
      : "memory", "cc", "xmm0");
}